

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

long __thiscall
TPZMatrix<long>::ConditionNumber(TPZMatrix<long> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  TPZFMatrix<long> Inv;
  TPZFMatrix<long> local_b0;
  
  TPZFMatrix<long>::TPZFMatrix(&local_b0);
  lVar2 = MatrixNorm(this,p,numiter,tol);
  iVar1 = Inverse(this,&local_b0,ENoDecompose);
  if (iVar1 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<long>::ConditionNumber(int, int64_t, REAL) [T = long]")
    ;
    poVar4 = std::operator<<(poVar4," - it was not possible to compute the inverse matrix.");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar3 = 0;
  }
  else {
    lVar3 = MatrixNorm(&local_b0.super_TPZMatrix<long>,p,numiter,tol);
    lVar3 = lVar3 * lVar2;
  }
  TPZFMatrix<long>::~TPZFMatrix(&local_b0);
  return lVar3;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}